

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O0

SinkFinalizeType __thiscall
duckdb::PhysicalUngroupedAggregate::FinalizeDistinct
          (PhysicalUngroupedAggregate *this,Pipeline *pipeline,Event *event,ClientContext *context,
          GlobalSinkState *gstate_p)

{
  UngroupedAggregateGlobalSinkState *this_00;
  ClientContext *context_00;
  pointer pDVar1;
  GlobalSinkState *pGVar2;
  shared_ptr<duckdb::Event,_true> *in_RDX;
  shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_true> new_event;
  GlobalSinkState *radix_state;
  value_type *radix_table_p;
  idx_t table_idx;
  DistinctAggregateState *distinct_state;
  UngroupedAggregateGlobalSinkState *gstate;
  size_type in_stack_ffffffffffffff58;
  shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_true> *ref;
  GlobalSinkState *in_stack_ffffffffffffff60;
  Pipeline *in_stack_ffffffffffffff90;
  UngroupedAggregateGlobalSinkState *in_stack_ffffffffffffff98;
  element_type *in_stack_ffffffffffffffa0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffa8;
  Event *in_stack_ffffffffffffffb0;
  GlobalSinkState *pGVar3;
  GlobalSinkState *gstate_p_00;
  
  this_00 = GlobalSinkState::Cast<duckdb::UngroupedAggregateGlobalSinkState>
                      (in_stack_ffffffffffffff60);
  context_00 = (ClientContext *)
               unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
               ::operator*((unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
                            *)in_stack_ffffffffffffff60);
  pGVar3 = (GlobalSinkState *)0x0;
  while( true ) {
    gstate_p_00 = pGVar3;
    pDVar1 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
             ::operator->((unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
                           *)in_stack_ffffffffffffff60);
    pGVar2 = (GlobalSinkState *)
             ::std::
             vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
             ::size(&(pDVar1->radix_tables).
                     super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
                   );
    if (pGVar2 <= pGVar3) break;
    unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
    ::operator->((unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
                  *)in_stack_ffffffffffffff60);
    vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                  *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                  *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_stack_ffffffffffffffb0 =
         (Event *)unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                  ::operator*((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                               *)in_stack_ffffffffffffff60);
    unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
    ::operator->((unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                  *)in_stack_ffffffffffffff60);
    RadixPartitionedHashTable::Finalize((RadixPartitionedHashTable *)this_00,context_00,gstate_p_00)
    ;
    pGVar3 = (GlobalSinkState *)((long)&gstate_p_00->_vptr_GlobalSinkState + 1);
  }
  ref = (shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_true> *)
        &stack0xffffffffffffffa0;
  make_shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,duckdb::ClientContext&,duckdb::PhysicalUngroupedAggregate_const&,duckdb::UngroupedAggregateGlobalSinkState&,duckdb::Pipeline&>
            ((ClientContext *)in_stack_ffffffffffffffa8._M_pi,
             (PhysicalUngroupedAggregate *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90);
  shared_ptr<duckdb::Event,_true>::shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_0>
            (in_RDX,ref);
  Event::InsertEvent(in_stack_ffffffffffffffb0,
                     (shared_ptr<duckdb::Event,_true> *)in_stack_ffffffffffffffa8._M_pi);
  shared_ptr<duckdb::Event,_true>::~shared_ptr((shared_ptr<duckdb::Event,_true> *)0x171a2ad);
  shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_true>::~shared_ptr
            ((shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeEvent,_true> *)0x171a2b7);
  return READY;
}

Assistant:

SinkFinalizeType PhysicalUngroupedAggregate::FinalizeDistinct(Pipeline &pipeline, Event &event, ClientContext &context,
                                                              GlobalSinkState &gstate_p) const {
	auto &gstate = gstate_p.Cast<UngroupedAggregateGlobalSinkState>();
	D_ASSERT(distinct_data);
	auto &distinct_state = *gstate.distinct_state;

	for (idx_t table_idx = 0; table_idx < distinct_data->radix_tables.size(); table_idx++) {
		auto &radix_table_p = distinct_data->radix_tables[table_idx];
		auto &radix_state = *distinct_state.radix_states[table_idx];
		radix_table_p->Finalize(context, radix_state);
	}
	auto new_event = make_shared_ptr<UngroupedDistinctAggregateFinalizeEvent>(context, *this, gstate, pipeline);
	event.InsertEvent(std::move(new_event));
	return SinkFinalizeType::READY;
}